

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverMaxPlus.cpp
# Opt level: O2

void __thiscall
BGCG_SolverMaxPlus::BGCG_SolverMaxPlus
          (BGCG_SolverMaxPlus *this,shared_ptr<const_BayesianGameCollaborativeGraphical> *bgcg,
          size_t maxiter,string *updateType,int verbosity,double damping,size_t nrSolutions,
          size_t nrRestarts)

{
  string local_48;
  
  BGCG_Solver::BGCG_Solver(&this->super_BGCG_Solver,bgcg,nrSolutions);
  std::__cxx11::string::string((string *)&local_48,(string *)updateType);
  MaxPlusSolverForBGs::MaxPlusSolverForBGs
            (&this->super_MaxPlusSolverForBGs,maxiter,&local_48,verbosity,damping,nrSolutions,
             nrRestarts);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_BGCG_Solver).super_BayesianGameIdenticalPayoffSolver.
  _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)&PTR_InitDeadline_005d5980;
  return;
}

Assistant:

BGCG_SolverMaxPlus::BGCG_SolverMaxPlus(
            const boost::shared_ptr<const BayesianGameCollaborativeGraphical> &bgcg,                
            size_t maxiter,
            std::string updateType,
            int verbosity,
            double damping,
            size_t nrSolutions,
            size_t nrRestarts)
    :
        BGCG_Solver(bgcg,  nrSolutions),
        MaxPlusSolverForBGs(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
{
}